

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O0

VP8LRefsCursor * VP8LRefsCursorInit(VP8LRefsCursor *__return_storage_ptr__,VP8LBackwardRefs *refs)

{
  VP8LBackwardRefs *refs_local;
  
  __return_storage_ptr__->cur_block = refs->refs;
  if (refs->refs == (PixOrCopyBlock *)0x0) {
    __return_storage_ptr__->cur_pos = (PixOrCopy *)0x0;
    __return_storage_ptr__->last_pos = (PixOrCopy *)0x0;
  }
  else {
    __return_storage_ptr__->cur_pos = __return_storage_ptr__->cur_block->start;
    __return_storage_ptr__->last_pos =
         __return_storage_ptr__->cur_pos + __return_storage_ptr__->cur_block->size;
  }
  return __return_storage_ptr__;
}

Assistant:

VP8LRefsCursor VP8LRefsCursorInit(const VP8LBackwardRefs* const refs) {
  VP8LRefsCursor c;
  c.cur_block = refs->refs;
  if (refs->refs != NULL) {
    c.cur_pos = c.cur_block->start;
    c.last_pos = c.cur_pos + c.cur_block->size;
  } else {
    c.cur_pos = NULL;
    c.last_pos = NULL;
  }
  return c;
}